

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

_Bool portfwdmgr_listen(PortFwdManager *mgr,char *host,int port,char *keyhost,int keyport,Conf *conf
                       )

{
  PortFwdRecord *pfr;
  char *pcVar1;
  PortFwdRecord *pPVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar1 = (char *)0x0;
  pfr = (PortFwdRecord *)safemalloc(1,0x48,0);
  pfr->type = 0x4c;
  if (host != (char *)0x0) {
    pcVar1 = dupstr(host);
  }
  pfr->saddr = pcVar1;
  if (keyhost == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = dupstr(keyhost);
  }
  pfr->daddr = pcVar1;
  pfr->sserv = (char *)0x0;
  pfr->dserv = (char *)0x0;
  pfr->sport = port;
  pfr->dport = keyport;
  pfr->local = (PortListener *)0x0;
  pfr->remote = (ssh_rportfwd *)0x0;
  pfr->addressfamily = 0;
  pPVar2 = (PortFwdRecord *)add234(mgr->forwardings,pfr);
  if (pPVar2 == pfr) {
    pcVar1 = pfl_listen(keyhost,keyport,host,port,mgr->cl,conf,&pfr->local,pfr->addressfamily);
    pcVar3 = "Failed to listen";
    if (pcVar1 == (char *)0x0) {
      pcVar3 = "Listening";
    }
    pcVar4 = ": ";
    pcVar5 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      pcVar4 = "";
      pcVar5 = "";
    }
    logeventf(mgr->cl->logctx,"%s on port %s:%d to forward to client%s%s",pcVar3,host,
              (ulong)(uint)port,pcVar4,pcVar5);
    if (pcVar1 == (char *)0x0) {
      return true;
    }
    safefree(pcVar1);
    del234(mgr->forwardings,pfr);
  }
  pfr_free(pfr);
  return false;
}

Assistant:

bool portfwdmgr_listen(PortFwdManager *mgr, const char *host, int port,
                       const char *keyhost, int keyport, Conf *conf)
{
    PortFwdRecord *pfr;

    pfr = snew(PortFwdRecord);
    pfr->type = 'L';
    pfr->saddr = host ? dupstr(host) : NULL;
    pfr->daddr = keyhost ? dupstr(keyhost) : NULL;
    pfr->sserv = pfr->dserv = NULL;
    pfr->sport = port;
    pfr->dport = keyport;
    pfr->local = NULL;
    pfr->remote = NULL;
    pfr->addressfamily = ADDRTYPE_UNSPEC;

    PortFwdRecord *existing = add234(mgr->forwardings, pfr);
    if (existing != pfr) {
        /*
         * We had this record already. Return failure.
         */
        pfr_free(pfr);
        return false;
    }

    char *err = pfl_listen(keyhost, keyport, host, port,
                           mgr->cl, conf, &pfr->local, pfr->addressfamily);
    logeventf(mgr->cl->logctx,
              "%s on port %s:%d to forward to client%s%s",
              err ? "Failed to listen" : "Listening", host, port,
              err ? ": " : "", err ? err : "");
    if (err) {
        sfree(err);
        del234(mgr->forwardings, pfr);
        pfr_free(pfr);
        return false;
    }

    return true;
}